

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O0

vm_obj_id_t CVmObjHTTPServer::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  CVmWeakRefable *this;
  vm_httpsrv_ext *pvVar3;
  char *pcVar4;
  TadsListener *pTVar5;
  uint in_ESI;
  char *errmsg_1;
  TadsHttpListenerThread *ht;
  vm_httpsrv_ext *ext;
  CVmObjHTTPServer *l;
  int server_level;
  int client_level;
  int32_t ulim;
  int port;
  char addr [256];
  char *errmsg;
  vm_obj_id_t id;
  undefined4 in_stack_fffffffffffffe88;
  vm_obj_id_t in_stack_fffffffffffffe8c;
  CVmObjTable *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar6;
  TadsListenerThread *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  ushort in_stack_fffffffffffffeb6;
  char *in_stack_fffffffffffffeb8;
  int local_128;
  undefined1 local_124 [4];
  int32_t local_120;
  int local_11c;
  undefined1 local_118 [256];
  char *local_18;
  vm_obj_id_t local_10;
  uint local_c;
  
  if (3 < in_ESI) {
    err_throw(0);
  }
  local_c = in_ESI;
  memcpy(local_118,"localhost",0x100);
  if (local_c != 0) {
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
    }
    else {
      CVmBif::pop_str_val_buf
                ((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (size_t)in_stack_fffffffffffffe98);
    }
  }
  local_11c = 0;
  if (1 < local_c) {
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
    }
    else {
      local_11c = CVmBif::pop_int_val();
    }
  }
  if (2 < local_c) {
    pvVar2 = CVmStack::get(0);
    if (pvVar2->typ == VM_NIL) {
      CVmStack::discard();
    }
    else {
      local_120 = CVmBif::pop_long_val();
    }
  }
  (*G_host_ifc_X->_vptr_CVmHostIfc[5])(G_host_ifc_X,local_124,&local_128);
  iVar6 = local_128;
  if (local_128 != 0) {
    if (local_128 == 1) {
      iVar1 = stricmp((char *)in_stack_fffffffffffffe90,
                      (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar6 = local_128;
      if ((iVar1 == 0) ||
         (iVar1 = stricmp((char *)in_stack_fffffffffffffe90,
                          (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)),
         iVar6 = local_128, iVar1 == 0)) goto LAB_0025c99a;
    }
    else if (local_128 != 2) goto LAB_0025c99a;
    local_18 = "prohibited network access";
    CVmRun::push_string((CVmRun *)CONCAT44(local_128,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe98);
    CVmRun::throw_new_class
              ((CVmRun *)CONCAT44(local_128,in_stack_fffffffffffffea0),
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (uint)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    iVar6 = local_128;
  }
LAB_0025c99a:
  local_10 = vm_new_id((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  CVmObjTable::set_obj_transient(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  this = (CVmWeakRefable *)
         CVmObject::operator_new((size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  CVmObjHTTPServer((CVmObjHTTPServer *)this,in_stack_fffffffffffffe8c);
  pvVar3 = get_ext((CVmObjHTTPServer *)this);
  pcVar4 = (char *)operator_new(0xa0);
  TadsHttpListenerThread::TadsHttpListenerThread
            ((TadsHttpListenerThread *)CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)
             ,(vm_obj_id_t)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             (TadsMessageQueue *)CONCAT44(iVar6,in_stack_fffffffffffffea0),(long)pcVar4);
  pTVar5 = TadsListener::launch
                     (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb6,in_stack_fffffffffffffea8)
  ;
  pvVar3->l = pTVar5;
  CVmWeakRefable::release_ref(this);
  if (pvVar3->l == (TadsListener *)0x0) {
    CVmRun::push_string((CVmRun *)CONCAT44(iVar6,in_stack_fffffffffffffea0),pcVar4);
    CVmRun::throw_new_class
              ((CVmRun *)CONCAT44(iVar6,in_stack_fffffffffffffea0),
               (vm_obj_id_t)((ulong)pcVar4 >> 0x20),(uint)pcVar4,(char *)this);
  }
  pcVar4 = lib_copy_str((char *)this);
  pvVar3->addr = pcVar4;
  return local_10;
}

Assistant:

vm_obj_id_t CVmObjHTTPServer::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    vm_obj_id_t id;
    const char *errmsg;

    /* 
     *   parse arguments - new HTTPServer(addr?, port?) 
     */
    if (argc > 3)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* check for the address - use "localhost" by default */
    char addr[256] = "localhost";
    if (argc >= 1)
    {
        /* get the address - this must be a string or nil */
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            CVmBif::pop_str_val_buf(vmg_ addr, sizeof(addr));
    }

    /* check for a port - use 0 by default */
    int port = 0;
    if (argc >= 2)
    {
        /* get the port number - this must be an integer or nil */
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            port = CVmBif::pop_int_val(vmg0_);
    }

    /* check for an upload size limit */
    int32_t ulim;
    if (argc >= 3)
    {
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            ulim = CVmBif::pop_long_val(vmg0_);
    }

    /* get the network safety level, to determine if this is allowed */
    int client_level, server_level;
    G_host_ifc->get_net_safety(&client_level, &server_level);

    /* check the network server safety level */
    switch (server_level)
    {
    case VM_NET_SAFETY_MINIMUM:
        /* all access allowed - proceed */
        break;

    case VM_NET_SAFETY_LOCALHOST:
        /* 
         *   localhost only - if the host isn't 'localhost' or '127.0.0.1',
         *   don't allow it 
         */
        if (stricmp(addr, "localhost") != 0
            && stricmp(addr, "127.0.0.1") != 0)
            goto access_error;

        /* allow it */
        break;

    case VM_NET_SAFETY_MAXIMUM:
    access_error:
        /* no access allowed */
        errmsg = "prohibited network access";
        G_interpreter->push_string(vmg_ errmsg);
        G_interpreter->throw_new_class(vmg_ G_predef->net_safety_exception,
                                       1, errmsg);
        AFTER_ERR_THROW(break;)
    }

    /* 
     *   allocate the object ID - this type of construction never creates a
     *   root object 
     */
    id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* http servers are inherently transient */
    G_obj_table->set_obj_transient(id);

    /* create the object */
    CVmObjHTTPServer *l = new (vmg_ id) CVmObjHTTPServer(vmg_ TRUE);

    /* get the extension */
    vm_httpsrv_ext *ext = l->get_ext();

    /* create the listener thread object */
    TadsHttpListenerThread *ht = new TadsHttpListenerThread(
        id, G_net_queue, ulim);

    /* launch the listener */
    ext->l = TadsListener::launch(addr, (ushort)port, ht);

    /* we're done with the thread object (the listener took it over) */
    ht->release_ref();

    /* if the launch failed, throw an error */
    if (ext->l == 0)
    {
        /* throw a network error */
        const char *errmsg = "Unable to start HTTP server";
        G_interpreter->push_string(vmg_ errmsg);
        G_interpreter->throw_new_class(vmg_ G_predef->net_exception, 1, errmsg);
    }

    /* remember my requested binding address */
    ext->addr = lib_copy_str(addr);

    /* return the new ID */
    return id;
}